

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O2

int read_single_file<EIF>(EIF *pub,Pub_File *file,bool auto_split,int version,int first_id)

{
  pointer pEVar1;
  pointer puVar2;
  pointer pEVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  size_t sVar6;
  long lVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar namesize;
  byte local_f2;
  byte local_f1;
  Pub_File *local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e8;
  size_t last_split;
  char *local_d8;
  ulong local_d0;
  EIF *local_c8;
  ulong local_c0;
  string name;
  char buf [58];
  string shout;
  
  local_c8 = pub;
  __stream = fopen((file->filename)._M_dataplus._M_p,"rb");
  eodata_safe_fail_filename = (file->filename)._M_dataplus._M_p;
  local_f0 = file;
  if (__stream == (FILE *)0x0) {
LAB_0012a117:
    Console::Err("Could not load file: %s");
    exit(1);
  }
  local_f2 = first_id == 1 && auto_split;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  shout._M_dataplus._M_p = (pointer)&shout.field_2;
  shout._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  shout.field_2._M_local_buf[0] = '\0';
  buf[0x30] = '\0';
  buf[0x31] = '\0';
  buf[0x32] = '\0';
  buf[0x33] = '\0';
  buf[0x34] = '\0';
  buf[0x35] = '\0';
  buf[0x36] = '\0';
  buf[0x37] = '\0';
  buf[0x38] = '\0';
  buf[0x39] = '\0';
  buf[0x20] = '\0';
  buf[0x21] = '\0';
  buf[0x22] = '\0';
  buf[0x23] = '\0';
  buf[0x24] = '\0';
  buf[0x25] = '\0';
  buf[0x26] = '\0';
  buf[0x27] = '\0';
  buf[0x28] = '\0';
  buf[0x29] = '\0';
  buf[0x2a] = '\0';
  buf[0x2b] = '\0';
  buf[0x2c] = '\0';
  buf[0x2d] = '\0';
  buf[0x2e] = '\0';
  buf[0x2f] = '\0';
  buf[0x10] = '\0';
  buf[0x11] = '\0';
  buf[0x12] = '\0';
  buf[0x13] = '\0';
  buf[0x14] = '\0';
  buf[0x15] = '\0';
  buf[0x16] = '\0';
  buf[0x17] = '\0';
  buf[0x18] = '\0';
  buf[0x19] = '\0';
  buf[0x1a] = '\0';
  buf[0x1b] = '\0';
  buf[0x1c] = '\0';
  buf[0x1d] = '\0';
  buf[0x1e] = '\0';
  buf[0x1f] = '\0';
  uVar8 = 64000;
  if (first_id != 1 || !auto_split) {
    uVar8 = 900;
  }
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  if (0 < version) {
    uVar8 = 900;
  }
  local_d0 = (ulong)uVar8;
  iVar4 = fseek(__stream,10,0);
  if (iVar4 == 0) {
    sVar6 = fread(&namesize,1,1,__stream);
    if (sVar6 == 1) {
      local_e8 = &local_f0->splits;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(local_e8,4);
      local_c0 = (ulong)(uint)first_id;
      local_f1 = local_f2 ^ 1;
      local_d8 = "Auto-split file is too large (%d bytes too long): %s";
      uVar10 = 0;
      do {
        iVar4 = (int)uVar10;
        uVar9 = local_d0;
        if (local_d0 == uVar10) break;
        if ((int)((uVar10 & 0xffffffff) / 900) * -900 + iVar4 == 0 && local_f1 == 0) {
          lVar7 = ftell(__stream);
          puVar2 = (local_f0->splits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          uVar8 = 0xffffffff;
          if ((local_f0->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != puVar2) {
            uVar8 = ~(uint)puVar2[-1];
          }
          iVar5 = (int)lVar7 + uVar8;
          if (0xf9f8 < iVar5) {
            Console::Err("Auto-split file is too large (%d bytes too long): %s",
                         (ulong)(iVar5 - 0xf9f8),(local_f0->filename)._M_dataplus._M_p);
          }
          lVar7 = ftell(__stream);
          last_split = lVar7 - 1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (local_e8,&last_split);
        }
        uVar8 = PacketProcessor::Number(namesize,0xfe,0xfe,0xfe);
        namesize = (uchar)uVar8;
        std::__cxx11::string::resize((ulong)&name);
        if (((uchar)uVar8 != '\0') &&
           (sVar6 = fread(name._M_dataplus._M_p,1,(ulong)(uVar8 & 0xff),__stream),
           sVar6 != (uVar8 & 0xff))) {
          iVar4 = 0xd5;
LAB_0012a108:
          fclose(__stream);
          eodata_safe_fail(iVar4);
          goto LAB_0012a117;
        }
        sVar6 = fread(buf,1,0x3a,__stream);
        if (sVar6 != 0x3a) {
          iVar4 = 0xe0;
          goto LAB_0012a108;
        }
        iVar5 = (int)local_c0 + iVar4;
        uVar9 = (ulong)iVar5;
        pEVar3 = (local_c8->data).
                 super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar1 = pEVar3 + uVar9;
        pEVar1->id = iVar5;
        std::__cxx11::string::_M_assign((string *)&pEVar1->name);
        pub_read_record(pEVar3 + uVar9,buf);
        if ((ulong)(((long)(local_c8->data).
                           super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_c8->data).
                          super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar9) {
          uVar9 = (ulong)(iVar4 + 1);
          break;
        }
        sVar6 = fread(&namesize,1,1,__stream);
        uVar10 = uVar10 + 1;
        uVar9 = uVar10;
      } while (sVar6 == 1);
      last_split = ftell(__stream);
      puVar2 = (local_f0->splits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar4 = (int)last_split - (int)puVar2[-1];
      if (0xf9f8 < iVar4) {
        if ((local_f2 == 0) ||
           ((ulong)((long)puVar2 -
                   (long)(local_e8->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) < 9)) {
          local_d8 = "File is too large (%d bytes too long): %s";
        }
        Console::Err(local_d8,(ulong)(iVar4 - 0xf9f8),(local_f0->filename)._M_dataplus._M_p);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(local_e8,&last_split);
      fclose(__stream);
      std::__cxx11::string::~string((string *)&shout);
      std::__cxx11::string::~string((string *)&name);
      return (int)uVar9;
    }
    iVar4 = 0xbb;
  }
  else {
    iVar4 = 0xba;
  }
  fclose(__stream);
  eodata_safe_fail(iVar4);
  std::__cxx11::string::~string((string *)&shout);
  std::__cxx11::string::~string((string *)&name);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int read_single_file(T& pub, Pub_File& file, bool auto_split, int version, int first_id)
{
	std::FILE *fh = std::fopen(file.filename.c_str(), "rb");
	eodata_safe_fail_filename = file.filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", file.filename.c_str());
		std::exit(1);
	}

	// Only attempt to auto-split the first file
	if (first_id != 1)
		auto_split = false;

	unsigned char namesize, shoutsize;
	std::string name, shout;
	char buf[T::DATA_SIZE] = {0};

	int readobj = 0;
	int max_entries = T::FILE_MAX_ENTRIES;

	if constexpr (std::is_same_v<T, ECF>)
	{
		if (version >= 1)
			max_entries = T::FILE_MAX_ENTRIES_V2;
	}

	if (version < 1 && auto_split == true)
		max_entries = 64000;

	SAFE_SEEK(fh, 10, SEEK_SET);
	SAFE_READ(static_cast<void *>(&namesize), sizeof(char), 1, fh);

	if constexpr (std::is_same_v<T, ESF>)
	{
		SAFE_READ(static_cast<void *>(&shoutsize), sizeof(char), 1, fh);
	}

	file.splits.reserve(4);

	for (int i = 0; i < max_entries; ++i)
	{
		if (auto_split && (i % T::FILE_MAX_ENTRIES == 0))
		{
			std::size_t split = std::size_t(std::ftell(fh)) - 1;
			int size = (int)split - (file.splits.empty() ? 0 : (int)file.splits.back());

			if (size > 63992)
				Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());

			file.splits.push_back(std::size_t(std::ftell(fh)) - 1);
		}

		namesize = PacketProcessor::Number(namesize);
		name.resize(namesize);

		if (namesize > 0)
			SAFE_READ(&name[0], sizeof(char), namesize, fh);

		if constexpr (std::is_same_v<T, ESF>)
		{
			shoutsize = PacketProcessor::Number(shoutsize);
			shout.resize(shoutsize);

			if (shoutsize > 0)
				SAFE_READ(&shout[0], sizeof(char), shoutsize, fh);
		}

		SAFE_READ(buf, sizeof(char), T::DATA_SIZE, fh);

		typename T::data_t& newdata = pub.data[first_id + i];

		++readobj;

		newdata.id = first_id + i;
		newdata.name = name;

		if constexpr (std::is_same_v<T, ESF>)
		{
			newdata.shout = shout;
		}

		pub_read_record(newdata, buf);

		if (first_id + i >= pub.data.size()
		 || std::fread(static_cast<void *>(&namesize), sizeof(char), 1, fh) != 1)
		{
			break;
		}

		if constexpr (std::is_same_v<T, ESF>)
		{
			if (std::fread(static_cast<void *>(&shoutsize), sizeof(char), 1, fh) != 1)
			{
				break;
			}
		}
	}

	std::size_t last_split = std::size_t(std::ftell(fh));
	int size = (int)last_split - (int)file.splits.back();

	if (size > 63992)
	{
		if (auto_split && file.splits.size() > 1)
			Console::Err("Auto-split file is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
		else
			Console::Err("File is too large (%d bytes too long): %s", size - 63992, file.filename.c_str());
	}

	file.splits.push_back(last_split);

	std::fclose(fh);

	return readobj;
}